

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall
duckdb_re2::DFA::InlinedSearchLoop<false,false,false>(DFA *this,SearchParams *params)

{
  byte bVar1;
  const_pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  uint uVar5;
  State *pSVar6;
  State *pSVar7;
  State *pSVar8;
  long lVar9;
  int *__dest;
  ulong uVar10;
  const_pointer pcVar11;
  const_pointer pcVar12;
  const_pointer pcVar13;
  size_t sVar14;
  bool bVar15;
  const_pointer pcVar16;
  uint c;
  const_pointer local_248;
  State *local_238;
  int *local_230;
  int *local_228;
  StateSaver local_208;
  Prog *local_1e0;
  StateSaver local_1d8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pSVar6 = params->start;
  pcVar2 = (params->text).data_;
  sVar3 = (params->text).size_;
  pcVar13 = pcVar2 + sVar3;
  local_1e0 = this->prog_;
  if ((pSVar6->flag_ & 0x100) == 0) {
    bVar15 = false;
    local_248 = (const_pointer)0x0;
  }
  else {
    bVar15 = true;
    local_248 = pcVar13;
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar6->ninst_)) {
      uVar10 = (long)pSVar6->ninst_ + 1;
      do {
        if (pSVar6->inst_[uVar10 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[uVar10 - 2]);
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
  }
  if (sVar3 != 0) {
    pcVar16 = (const_pointer)0x0;
    pcVar11 = pcVar13;
    pSVar8 = pSVar6;
    local_238 = pSVar6;
    do {
      pcVar12 = pcVar11 + -1;
      bVar1 = pcVar11[-1];
      pSVar6 = pSVar8->next_[local_1e0->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar6 == (State *)0x0) {
        pSVar6 = RunStateOnByteUnlocked(this,pSVar8,(uint)bVar1);
        if (pSVar6 == (State *)0x0) {
          if (((dfa_should_bail_when_slow == '\x01') && (pcVar16 != (const_pointer)0x0)) &&
             (((ulong)((long)pcVar12 - (long)pcVar16) <
               (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
            params->failed = true;
            return false;
          }
          if ((State *)&DAT_00000002 < local_238) {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = local_238->ninst_;
            local_208.flag_ = local_238->flag_;
            lVar9 = (long)local_208.ninst_;
            sVar14 = lVar9 * 4;
            if (local_208.ninst_ < 0) {
              sVar14 = 0xffffffffffffffff;
            }
            local_208.dfa_ = this;
            local_228 = (int *)operator_new__(sVar14);
            local_208.inst_ = local_228;
            memmove(local_228,local_238->inst_,lVar9 * 4);
          }
          else {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.special_ = local_238;
            local_228 = (int *)0x0;
            local_208.dfa_ = this;
          }
          local_1d8.dfa_ = this;
          if ((State *)&DAT_00000002 < pSVar8) {
            local_1d8.is_special_ = false;
            local_1d8.special_ = (State *)0x0;
            local_1d8.ninst_ = pSVar8->ninst_;
            local_1d8.flag_ = pSVar8->flag_;
            lVar9 = (long)local_1d8.ninst_;
            sVar14 = lVar9 * 4;
            if (local_1d8.ninst_ < 0) {
              sVar14 = 0xffffffffffffffff;
            }
            local_230 = (int *)operator_new__(sVar14);
            local_1d8.inst_ = local_230;
            memmove(local_230,pSVar8->inst_,lVar9 * 4);
          }
          else {
            local_1d8.inst_ = (int *)0x0;
            local_1d8.ninst_ = 0;
            local_1d8.flag_ = 0;
            local_1d8.is_special_ = true;
            local_230 = (int *)0x0;
            local_1d8.special_ = pSVar8;
          }
          ResetCache(this,params->cache_lock);
          pSVar7 = StateSaver::Restore(&local_208);
          if ((pSVar7 == (State *)0x0) ||
             (pSVar6 = StateSaver::Restore(&local_1d8), pSVar6 == (State *)0x0)) {
LAB_004858cb:
            params->failed = true;
            bVar4 = false;
            pSVar6 = (State *)0x0;
          }
          else {
            pSVar6 = RunStateOnByteUnlocked(this,pSVar6,(uint)bVar1);
            if (pSVar6 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_004858cb;
            }
            bVar4 = true;
          }
          if (((State *)&DAT_00000002 < pSVar8) && (local_230 != (int *)0x0)) {
            operator_delete__(local_230);
          }
          if (((State *)&DAT_00000002 < local_238) && (local_228 != (int *)0x0)) {
            operator_delete__(local_228);
          }
          pcVar16 = pcVar12;
          local_238 = pSVar7;
          if (!bVar4) {
            return false;
          }
        }
      }
      if (pSVar6 < (State *)&DAT_00000003) {
        if (pSVar6 == (State *)0x1) {
          params->ep = local_248;
          return bVar15;
        }
        goto LAB_00485b33;
      }
      if (((((pSVar6->flag_ & 0x100) != 0) &&
           (bVar15 = true, local_248 = pcVar11, params->matches != (SparseSet *)0x0)) &&
          (this->kind_ == kManyMatch)) && (0 < (long)pSVar6->ninst_)) {
        uVar10 = (long)pSVar6->ninst_ + 1;
        do {
          if (pSVar6->inst_[uVar10 - 2] == -2) break;
          SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[uVar10 - 2]);
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      pcVar13 = pcVar2;
      pcVar11 = pcVar12;
      pSVar8 = pSVar6;
    } while (pcVar12 != pcVar2);
  }
  pcVar11 = (params->text).data_;
  if (pcVar11 == (params->context).data_) {
    uVar5 = this->prog_->bytemap_range_;
    c = 0x100;
  }
  else {
    bVar1 = pcVar11[-1];
    c = (uint)bVar1;
    uVar5 = (uint)this->prog_->bytemap_[bVar1];
  }
  pSVar8 = pSVar6->next_[(int)uVar5]._M_b._M_p;
  if ((pSVar8 != (State *)0x0) ||
     (pSVar8 = RunStateOnByteUnlocked(this,pSVar6,c), pSVar8 != (State *)0x0)) goto LAB_00485ad5;
  if ((State *)&DAT_00000002 < pSVar6) {
    local_208.is_special_ = false;
    local_208.special_ = (State *)0x0;
    local_208.ninst_ = pSVar6->ninst_;
    local_208.flag_ = pSVar6->flag_;
    lVar9 = (long)local_208.ninst_;
    uVar10 = 0xffffffffffffffff;
    if (-1 < local_208.ninst_) {
      uVar10 = lVar9 * 4;
    }
    local_208.dfa_ = this;
    __dest = (int *)operator_new__(uVar10);
    local_208.inst_ = __dest;
    memmove(__dest,pSVar6->inst_,lVar9 * 4);
  }
  else {
    local_208.inst_ = (int *)0x0;
    local_208.ninst_ = 0;
    local_208.flag_ = 0;
    local_208.is_special_ = true;
    __dest = (int *)0x0;
    local_208.dfa_ = this;
    local_208.special_ = pSVar6;
  }
  ResetCache(this,params->cache_lock);
  pSVar8 = StateSaver::Restore(&local_208);
  if (pSVar8 == (State *)0x0) {
LAB_00485ab0:
    params->failed = true;
    bVar4 = false;
    pSVar8 = (State *)0x0;
  }
  else {
    pSVar8 = RunStateOnByteUnlocked(this,pSVar8,c);
    if (pSVar8 == (State *)0x0) {
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_00485ab0;
    }
    bVar4 = true;
  }
  if (((State *)&DAT_00000002 < pSVar6) && (__dest != (int *)0x0)) {
    operator_delete__(__dest);
  }
  if (!bVar4) {
    return false;
  }
LAB_00485ad5:
  if (pSVar8 < (State *)&DAT_00000003) {
    if (pSVar8 != (State *)0x1) {
LAB_00485b33:
      params->ep = pcVar2;
      return true;
    }
  }
  else if (((((pSVar8->flag_ & 0x100) != 0) &&
            (bVar15 = true, local_248 = pcVar13, params->matches != (SparseSet *)0x0)) &&
           (this->kind_ == kManyMatch)) && (0 < (long)pSVar8->ninst_)) {
    uVar10 = (long)pSVar8->ninst_ + 1;
    do {
      if (pSVar8->inst_[uVar10 - 2] == -2) break;
      SparseSetT<void>::InsertInternal(params->matches,true,pSVar8->inst_[uVar10 - 2]);
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  params->ep = local_248;
  return bVar15;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}